

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QString * waitForError<QList<int>,QString>
                    (QString *__return_storage_ptr__,QPromise<QList<int>_> *promise,QString *initial
                    )

{
  QPromise<QList<int>_> local_48;
  QPromiseBase<QList<int>_> local_38;
  undefined1 local_21;
  QString *local_20;
  QString *initial_local;
  QPromise<QList<int>_> *promise_local;
  QString *error;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QString *)promise;
  promise_local = (QPromise<QList<int>_> *)__return_storage_ptr__;
  QString::QString(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<QList<int>>::
  fail<waitForError<QList<int>,QString>(QtPromise::QPromise<QList<int>>const&,QString_const&)::_lambda(QString_const&)_1_>
            ((QPromiseBase<QList<int>> *)&local_48,(anon_class_8_1_a7dec128 *)initial_local);
  QtPromise::QPromiseBase<QList<int>_>::wait(&local_38,&local_48);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)&local_38);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<T>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
            return T();
        })
        .wait();
    return error;
}